

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad.c
# Opt level: O3

int copyprop(int i,int j)

{
  int iVar1;
  int iVar2;
  
  iVar1 = intcode[i].op1.opnd;
  iVar2 = 1;
  if (iVar1 != intcode[j].op2.opnd) {
    iVar2 = (uint)(iVar1 == intcode[j].op3.opnd) * 2;
  }
  return iVar2;
}

Assistant:

int	copyprop(int i, int j)
{
    if (intcode[i].op1.opnd == intcode[j].op2.opnd)
        return(1);
    else if (intcode[i].op1.opnd == intcode[j].op3.opnd)
        return(2);
    else
        return(0);
}